

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

void __thiscall ipx::Model::ScaleModel(Model *this,Control *control)

{
  double dVar1;
  bool bVar2;
  uint uVar3;
  ipxint iVar4;
  double *pdVar5;
  size_t sVar6;
  Control *in_RSI;
  valarray<double> *in_RDI;
  SparseMatrix *unaff_retaddr;
  Int j;
  Model *in_stack_00000180;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar7;
  valarray<double> *__v;
  
  __v = in_RDI;
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x841754);
  for (iVar7 = 0; iVar7 < (int)in_RDI[0x17]._M_size; iVar7 = iVar7 + 1) {
    pdVar5 = std::valarray<double>::operator[]
                       ((valarray<double> *)&in_RDI[0x1f]._M_data,(long)iVar7);
    bVar2 = std::isfinite(*pdVar5);
    if (bVar2) {
      pdVar5 = std::valarray<double>::operator[]
                         ((valarray<double> *)&in_RDI[0x1e]._M_data,(long)iVar7);
      uVar3 = std::isinf(*pdVar5);
      if ((uVar3 & 1) != 0) {
        pdVar5 = std::valarray<double>::operator[]
                           ((valarray<double> *)&in_RDI[0x1f]._M_data,(long)iVar7);
        dVar1 = *pdVar5;
        pdVar5 = std::valarray<double>::operator[]
                           ((valarray<double> *)&in_RDI[0x1e]._M_data,(long)iVar7);
        *pdVar5 = -dVar1;
        pdVar5 = std::valarray<double>::operator[]
                           ((valarray<double> *)&in_RDI[0x1f]._M_data,(long)iVar7);
        *pdVar5 = INFINITY;
        ScaleColumn(unaff_retaddr,(Int)((ulong)__v >> 0x20),(double)in_RSI);
        pdVar5 = std::valarray<double>::operator[]
                           ((valarray<double> *)&in_RDI[0x1c]._M_data,(long)iVar7);
        *pdVar5 = *pdVar5 * -1.0;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_RSI,
                   (value_type_conflict2 *)CONCAT44(iVar7,in_stack_ffffffffffffffe8));
      }
    }
  }
  std::valarray<double>::resize
            ((valarray<double> *)in_RSI,CONCAT44(iVar7,in_stack_ffffffffffffffe8),(double)in_RDI);
  std::valarray<double>::resize
            ((valarray<double> *)in_RSI,CONCAT44(iVar7,in_stack_ffffffffffffffe8),(double)in_RDI);
  iVar4 = Control::scale(in_RSI);
  if (0 < iVar4) {
    EquilibrateMatrix(in_stack_00000180);
  }
  sVar6 = std::valarray<double>::size(in_RDI + 0x2a);
  if (sVar6 != 0) {
    std::valarray<double>::operator*=((valarray<double> *)unaff_retaddr,__v);
    std::valarray<double>::operator/=((valarray<double> *)unaff_retaddr,__v);
    std::valarray<double>::operator/=((valarray<double> *)unaff_retaddr,__v);
  }
  sVar6 = std::valarray<double>::size(in_RDI + 0x2b);
  if (sVar6 != 0) {
    std::valarray<double>::operator*=((valarray<double> *)unaff_retaddr,__v);
  }
  return;
}

Assistant:

void Model::ScaleModel(const Control& control) {
    flipped_vars_.clear();
    for (Int j = 0; j < num_var_; j++) {
        if (std::isfinite(scaled_ubuser_[j]) && std::isinf(scaled_lbuser_[j])) {
            scaled_lbuser_[j] = -scaled_ubuser_[j];
            scaled_ubuser_[j] = INFINITY;
            ScaleColumn(A_, j, -1.0);
            scaled_obj_[j] *= -1.0;
            flipped_vars_.push_back(j);
        }
    }
    colscale_.resize(0);
    rowscale_.resize(0);

    // Choose scaling method.
    if (control.scale() >= 1)
        EquilibrateMatrix();

    // Apply scaling to vectors.
    if (colscale_.size() > 0) {
        assert((Int)colscale_.size() == num_var_);
        scaled_obj_ *= colscale_;
        scaled_lbuser_ /= colscale_;
        scaled_ubuser_ /= colscale_;
    }
    if (rowscale_.size() > 0) {
        assert((Int)rowscale_.size() == num_constr_);
        scaled_rhs_ *= rowscale_;
    }
}